

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFDebugLine::LineTable::getFileLineInfoForAddress
          (LineTable *this,SectionedAddress Address,char *CompDir,FileLineInfoKind Kind,
          DILineInfo *Result)

{
  pointer pRVar1;
  DILineInfo *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::StringRef,_true>_2 local_68;
  undefined8 local_58;
  StringRef local_50;
  DILineInfo *local_40;
  uint64_t local_38;
  
  uVar4 = lookupAddress(this,Address);
  if (uVar4 != 0xffffffff) {
    pRVar1 = (this->Rows).
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (uint64_t)pRVar1[uVar4].File;
    local_40 = Result;
    StringRef::StringRef(&local_50,CompDir);
    pDVar2 = local_40;
    bVar3 = getFileNameByIndex(this,local_38,local_50,Kind,&local_40->FileName);
    if (bVar3) {
      pDVar2->Line = pRVar1[uVar4].Line;
      pDVar2->Column = (uint)pRVar1[uVar4].Column;
      pDVar2->Discriminator = pRVar1[uVar4].Discriminator;
      getSourceByIndex((Optional<llvm::StringRef> *)&local_68.value,this,(ulong)pRVar1[uVar4].File,
                       Kind);
      *(undefined8 *)&(pDVar2->Source).Storage.hasVal = local_58;
      (pDVar2->Source).Storage.field_0.value.Data = local_68.value.Data;
      (pDVar2->Source).Storage.field_0.value.Length = local_68.value.Length;
      return true;
    }
  }
  return false;
}

Assistant:

bool DWARFDebugLine::LineTable::getFileLineInfoForAddress(
    object::SectionedAddress Address, const char *CompDir,
    FileLineInfoKind Kind, DILineInfo &Result) const {
  // Get the index of row we're looking for in the line table.
  uint32_t RowIndex = lookupAddress(Address);
  if (RowIndex == -1U)
    return false;
  // Take file number and line/column from the row.
  const auto &Row = Rows[RowIndex];
  if (!getFileNameByIndex(Row.File, CompDir, Kind, Result.FileName))
    return false;
  Result.Line = Row.Line;
  Result.Column = Row.Column;
  Result.Discriminator = Row.Discriminator;
  Result.Source = getSourceByIndex(Row.File, Kind);
  return true;
}